

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<unsigned_int>::emplace<unsigned_int&>
          (QPodArrayOps<unsigned_int> *this,qsizetype i,uint *args)

{
  uint uVar1;
  Data *pDVar2;
  long lVar3;
  uint *puVar4;
  GrowthPosition where;
  
  pDVar2 = (this->super_QArrayDataPointer<unsigned_int>).d;
  if ((pDVar2 != (Data *)0x0) &&
     ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    lVar3 = (this->super_QArrayDataPointer<unsigned_int>).size;
    if ((lVar3 == i) &&
       (puVar4 = (this->super_QArrayDataPointer<unsigned_int>).ptr,
       (pDVar2->super_QArrayData).alloc !=
       ((long)((long)puVar4 -
              ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 2) +
       i)) {
      puVar4[i] = *args;
      (this->super_QArrayDataPointer<unsigned_int>).size = i + 1;
      return;
    }
    if ((i == 0) &&
       (puVar4 = (this->super_QArrayDataPointer<unsigned_int>).ptr,
       (uint *)((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) !=
       puVar4)) {
      puVar4[-1] = *args;
      (this->super_QArrayDataPointer<unsigned_int>).ptr = puVar4 + -1;
      (this->super_QArrayDataPointer<unsigned_int>).size = lVar3 + 1;
      return;
    }
  }
  uVar1 = *args;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<unsigned_int>).size != 0);
  QArrayDataPointer<unsigned_int>::detachAndGrow
            (&this->super_QArrayDataPointer<unsigned_int>,where,1,(uint **)0x0,
             (QArrayDataPointer<unsigned_int> *)0x0);
  puVar4 = createHole(this,where,i,1);
  *puVar4 = uVar1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }